

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  int iVar1;
  Expr *local_18;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  iVar1 = sqlite3ExprIsConstant((Parse *)0x0,pExpr);
  local_18 = pExpr;
  if (iVar1 == 0) {
    if (1 < pParse->eParseMode) {
      sqlite3RenameExprUnmap(pParse,pExpr);
    }
    sqlite3ExprDelete(pParse->db,pExpr);
    local_18 = sqlite3ExprAlloc(pParse->db,0x79,(Token *)0x0,0);
  }
  return local_18;
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(0,pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}